

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_thread.cpp
# Opt level: O2

DWORD GetCurrentThreadId(void)

{
  long lVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    lVar1 = syscall(0xba);
    if (PAL_InitializeChakraCoreCalled != false) {
      return (DWORD)lVar1;
    }
  }
  abort();
}

Assistant:

DWORD
PALAPI
GetCurrentThreadId(
            VOID)
{
    DWORD dwThreadId;

    PERF_ENTRY(GetCurrentThreadId);
    ENTRY("GetCurrentThreadId()\n");

    dwThreadId = (DWORD)THREADSilentGetCurrentThreadId();

    LOGEXIT("GetCurrentThreadId returns DWORD %#x\n", dwThreadId);
    PERF_EXIT(GetCurrentThreadId);

    return dwThreadId;
}